

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_div_2(mp_int *a,mp_int *b)

{
  mp_digit *pmVar1;
  mp_digit *pmVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint size;
  
  size = a->used;
  if (b->alloc < (int)size) {
    iVar5 = mp_grow(b,size);
    if (iVar5 != 0) {
      return iVar5;
    }
    size = a->used;
  }
  iVar5 = b->used;
  b->used = size;
  pmVar1 = b->dp;
  if (0 < (int)size) {
    pmVar2 = a->dp;
    uVar7 = size + 1;
    uVar8 = 0;
    lVar6 = (long)(int)size;
    do {
      lVar6 = lVar6 + -1;
      uVar3 = pmVar2[lVar6];
      pmVar1[lVar6] = uVar8 << 0x3b | uVar3 >> 1;
      uVar7 = uVar7 - 1;
      uVar8 = (ulong)((uint)uVar3 & 1);
    } while (1 < uVar7);
  }
  if ((int)size < iVar5) {
    memset(pmVar1 + (int)size,0,(ulong)(iVar5 + ~size) * 8 + 8);
  }
  b->sign = a->sign;
  if ((int)size < 1) {
    if (size != 0) {
      return 0;
    }
  }
  else {
    do {
      if (pmVar1[(ulong)size - 1] != 0) {
        return 0;
      }
      b->used = size - 1;
      bVar4 = 1 < (int)size;
      size = size - 1;
    } while (bVar4);
  }
  b->sign = 0;
  return 0;
}

Assistant:

int mp_div_2(mp_int * a, mp_int * b)
{
  int     x, res, oldused;

  /* copy */
  if (b->alloc < a->used) {
    if ((res = mp_grow (b, a->used)) != MP_OKAY) {
      return res;
    }
  }

  oldused = b->used;
  b->used = a->used;
  {
    register mp_digit r, rr, *tmpa, *tmpb;

    /* source alias */
    tmpa = a->dp + b->used - 1;

    /* dest alias */
    tmpb = b->dp + b->used - 1;

    /* carry */
    r = 0;
    for (x = b->used - 1; x >= 0; x--) {
      /* get the carry for the next iteration */
      rr = *tmpa & 1;

      /* shift the current digit, add in carry and store */
      *tmpb-- = (*tmpa-- >> 1) | (r << (DIGIT_BIT - 1));

      /* forward carry to next iteration */
      r = rr;
    }

    /* zero excess digits */
    tmpb = b->dp + b->used;
    for (x = b->used; x < oldused; x++) {
      *tmpb++ = 0;
    }
  }
  b->sign = a->sign;
  mp_clamp (b);
  return MP_OKAY;
}